

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
deqp::gles31::Functional::querySampleCounts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Functions *gl,deUint32 format)

{
  glGetInternalformativFunc p_Var1;
  GLenum GVar2;
  size_type sVar3;
  reference pvVar4;
  GLint local_20;
  GLenum local_1c;
  int numSampleCounts;
  deUint32 format_local;
  Functions *gl_local;
  vector<int,_std::allocator<int>_> *sampleCounts;
  
  local_20 = 0;
  local_1c = format;
  _numSampleCounts = gl;
  gl_local = (Functions *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  (*_numSampleCounts->getInternalformativ)(0x8d41,local_1c,0x9380,1,&local_20);
  if (0 < local_20) {
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(long)local_20);
    GVar2 = local_1c;
    p_Var1 = _numSampleCounts->getInternalformativ;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(__return_storage_ptr__);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](__return_storage_ptr__,0);
    (*p_Var1)(0x8d41,GVar2,0x80a9,(GLsizei)sVar3,pvVar4);
  }
  GVar2 = (*_numSampleCounts->getError)();
  glu::checkError(GVar2,"Failed to query sample counts for format",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
                  ,0x169);
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int> querySampleCounts (const glw::Functions& gl, deUint32 format)
{
	int					numSampleCounts		= 0;
	std::vector<int>	sampleCounts;

	gl.getInternalformativ(GL_RENDERBUFFER, format, GL_NUM_SAMPLE_COUNTS, 1, &numSampleCounts);

	if (numSampleCounts > 0)
	{
		sampleCounts.resize(numSampleCounts);
		gl.getInternalformativ(GL_RENDERBUFFER, format, GL_SAMPLES, (glw::GLsizei)sampleCounts.size(), &sampleCounts[0]);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to query sample counts for format");

	return sampleCounts;
}